

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::expr(GrpParser *this)

{
  RefAST *this_00;
  RefAST expr_AST;
  ASTPair currentAST;
  RefCount<AST> local_48;
  RefAST local_40;
  ASTPair local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_48.ref = nullAST.ref;
  local_38.root.ref = (Ref *)0x0;
  local_38.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  conditionalExpr(this);
  local_40.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
  if (local_40.ref != (Ref *)0x0) {
    (local_40.ref)->count = (local_40.ref)->count + 1;
  }
  ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_38,&local_40);
  RefCount<AST>::~RefCount(&local_40);
  RefCount<AST>::operator=(&local_48,&local_38.root);
  RefCount<AST>::operator=(this_00,&local_48);
  RefCount<AST>::~RefCount(&local_48);
  ASTPair::~ASTPair(&local_38);
  return;
}

Assistant:

void GrpParser::expr() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST expr_AST = nullAST;
	
	try {      // for error handling
		conditionalExpr();
		astFactory.addASTChild(currentAST, returnAST);
		expr_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_8);
	}
	returnAST = expr_AST;
}